

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O0

void __thiscall
google::
sparse_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
::sparse_hashtable(sparse_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                   *this,MoveDontCopyT mover,
                  sparse_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                  *ht,size_type min_buckets_wanted)

{
  undefined8 uVar1;
  undefined8 uVar2;
  size_type sVar3;
  size_type sVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4> *psVar7;
  undefined8 *in_RDX;
  sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4> *in_RDI;
  size_type in_stack_00000078;
  sparse_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *in_stack_00000080;
  MoveDontCopyT in_stack_0000008c;
  sparse_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *in_stack_00000090;
  sparse_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *in_stack_ffffffffffffffa8;
  libc_allocator_with_realloc<std::pair<const_int,_int>_> local_21 [33];
  
  uVar1 = *in_RDX;
  uVar2 = in_RDX[1];
  sVar3 = in_RDX[2];
  sVar4 = in_RDX[3];
  uVar5 = in_RDX[4];
  uVar6 = in_RDX[5];
  in_RDI->enlarge_factor_ = (float)(int)uVar5;
  in_RDI->shrink_factor_ = (float)(int)((ulong)uVar5 >> 0x20);
  in_RDI->consider_shrink_ = (bool)(char)uVar6;
  in_RDI->use_empty_ = (bool)(char)((ulong)uVar6 >> 8);
  in_RDI->use_deleted_ = (bool)(char)((ulong)uVar6 >> 0x10);
  in_RDI->field_0x2b = (char)((ulong)uVar6 >> 0x18);
  in_RDI->num_ht_copies_ = (int)((ulong)uVar6 >> 0x20);
  in_RDI->enlarge_threshold_ = sVar3;
  in_RDI->shrink_threshold_ = sVar4;
  (in_RDI->super_Hasher).id_ = (int)uVar1;
  (in_RDI->super_Hasher).num_hashes_ = (int)((ulong)uVar1 >> 0x20);
  *(undefined8 *)&(in_RDI->super_Hasher).num_compares_ = uVar2;
  uVar1 = in_RDX[6];
  uVar2 = in_RDX[7];
  in_RDI[1].super_Hasher.id_ = (int)uVar1;
  in_RDI[1].super_Hasher.num_hashes_ = (int)((ulong)uVar1 >> 0x20);
  *(undefined8 *)&in_RDI[1].super_Hasher.num_compares_ = uVar2;
  in_RDI[1].enlarge_threshold_ = 0;
  psVar7 = in_RDI + 1;
  get_allocator(in_stack_ffffffffffffffa8);
  sparsetable<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::sparsetable((sparsetable<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                 *)&psVar7->shrink_threshold_,0,local_21);
  libc_allocator_with_realloc<std::pair<const_int,_int>_>::~libc_allocator_with_realloc(local_21);
  bucket_count((sparse_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                *)0x100fb77);
  sparsehash_internal::sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>::reset_thresholds
            (in_RDI,(size_type)in_stack_ffffffffffffffa8);
  move_from(in_stack_00000090,in_stack_0000008c,in_stack_00000080,in_stack_00000078);
  return;
}

Assistant:

sparse_hashtable(MoveDontCopyT mover, sparse_hashtable& ht,
                   size_type min_buckets_wanted = HT_DEFAULT_STARTING_BUCKETS)
      : settings(ht.settings),
        key_info(ht.key_info),
        num_deleted(0),
        table(0, ht.get_allocator()) {
    settings.reset_thresholds(bucket_count());
    move_from(mover, ht, min_buckets_wanted);  // ignores deleted entries
  }